

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pg_functions.cpp
# Opt level: O3

void duckdb_libpgquery::pg_parser_parse(char *query,parse_result *res)

{
  PGList *pPVar1;
  long lVar2;
  
  res->parse_tree = (PGList *)0x0;
  pPVar1 = raw_parser(query);
  res->parse_tree = pPVar1;
  lVar2 = __tls_get_addr(&PTR_0248ae98);
  res->success = *(int *)(lVar2 + 0xa58) == 0;
  return;
}

Assistant:

void pg_parser_parse(const char *query, parse_result *res) {
	res->parse_tree = nullptr;
	try {
		res->parse_tree = duckdb_libpgquery::raw_parser(query);
		res->success = pg_parser_state.pg_err_code == PGUNDEFINED;
	} catch (std::exception &ex) {
		res->success = false;
		res->error_message = ex.what();
		res->error_location = pg_parser_state.pg_err_pos;
	}
}